

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall QHashPrivate::MultiNodeChain<int>::free(MultiNodeChain<int> *this,void *__ptr)

{
  MultiNodeChain<int> *pMVar1;
  MultiNodeChain<int> *n;
  MultiNodeChain<int> *e;
  qsizetype nEntries;
  MultiNodeChain<int> *local_18;
  
  pMVar1 = this;
  while (local_18 = pMVar1, local_18 != (MultiNodeChain<int> *)0x0) {
    pMVar1 = local_18->next;
    if (local_18 != (MultiNodeChain<int> *)0x0) {
      ~MultiNodeChain(local_18);
      operator_delete(local_18,0x10);
    }
  }
  return;
}

Assistant:

qsizetype free() noexcept(std::is_nothrow_destructible_v<T>)
    {
        qsizetype nEntries = 0;
        MultiNodeChain *e = this;
        while (e) {
            MultiNodeChain *n = e->next;
            ++nEntries;
            delete e;
            e = n;
        }
        return  nEntries;
    }